

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

ssize_t __thiscall
QXmlStreamWriterPrivate::write(QXmlStreamWriterPrivate *this,int __fd,void *__buf,size_t __n)

{
  long in_FS_OFFSET;
  QAnyStringView *unaff_retaddr;
  char *in_stack_ffffffffffffffb8;
  QMessageLogger *in_stack_ffffffffffffffc0;
  anon_class_8_1_8991fb9c *v;
  
  v = *(anon_class_8_1_8991fb9c **)(in_FS_OFFSET + 0x28);
  if (this->device == (QIODevice *)0x0) {
    if (this->stringDevice == (QString *)0x0) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int)((ulong)this >> 0x20),
                 (char *)this);
      QMessageLogger::warning
                ((QMessageLogger *)&stack0xffffffffffffffb8,"QXmlStreamWriter: No device");
    }
    else {
      QAnyStringView::visit<QXmlStreamWriterPrivate::write(QAnyStringView)::__1>(unaff_retaddr,v);
    }
  }
  else if ((*(ushort *)&this->field_0x78 >> 5 & 1) == 0) {
    QAnyStringView::visit<QXmlStreamWriterPrivate::write(QAnyStringView)::__0>(unaff_retaddr,v);
  }
  if (*(anon_class_8_1_8991fb9c **)(in_FS_OFFSET + 0x28) != v) {
    __stack_chk_fail();
  }
  return (ssize_t)*(anon_class_8_1_8991fb9c **)(in_FS_OFFSET + 0x28);
}

Assistant:

void QXmlStreamWriterPrivate::write(QAnyStringView s)
{
    if (device) {
        if (hasIoError)
            return;

        s.visit([&] (auto s) { doWriteToDevice(s); });
    } else if (stringDevice) {
        s.visit([&] (auto s) { stringDevice->append(s); });
    } else {
        qWarning("QXmlStreamWriter: No device");
    }
}